

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void rtreecheck(sqlite3_context *ctx,int nArg,sqlite3_value **apArg)

{
  uchar *puVar1;
  sqlite3 *db;
  char *local_50;
  uchar *local_40;
  char *zTab;
  char *zDb;
  char *zReport;
  sqlite3_value **ppsStack_20;
  int rc;
  sqlite3_value **apArg_local;
  sqlite3_context *psStack_10;
  int nArg_local;
  sqlite3_context *ctx_local;
  
  ppsStack_20 = apArg;
  apArg_local._4_4_ = nArg;
  psStack_10 = ctx;
  if ((nArg == 1) || (nArg == 2)) {
    zDb = (char *)0x0;
    puVar1 = sqlite3_value_text(*apArg);
    if (apArg_local._4_4_ == 1) {
      zTab = "main";
      local_40 = puVar1;
    }
    else {
      local_40 = sqlite3_value_text(ppsStack_20[1]);
      zTab = (char *)puVar1;
    }
    db = sqlite3_context_db_handle(psStack_10);
    zReport._4_4_ = rtreeCheckTable(db,zTab,(char *)local_40,&zDb);
    if (zReport._4_4_ == 0) {
      if (zDb == (char *)0x0) {
        local_50 = "ok";
      }
      else {
        local_50 = zDb;
      }
      sqlite3_result_text(psStack_10,local_50,-1,(_func_void_void_ptr *)0xffffffffffffffff);
    }
    else {
      sqlite3_result_error_code(psStack_10,zReport._4_4_);
    }
    sqlite3_free(zDb);
  }
  else {
    sqlite3_result_error(ctx,"wrong number of arguments to function rtreecheck()",-1);
  }
  return;
}

Assistant:

static void rtreecheck(
  sqlite3_context *ctx, 
  int nArg, 
  sqlite3_value **apArg
){
  if( nArg!=1 && nArg!=2 ){
    sqlite3_result_error(ctx, 
        "wrong number of arguments to function rtreecheck()", -1
    );
  }else{
    int rc;
    char *zReport = 0;
    const char *zDb = (const char*)sqlite3_value_text(apArg[0]);
    const char *zTab;
    if( nArg==1 ){
      zTab = zDb;
      zDb = "main";
    }else{
      zTab = (const char*)sqlite3_value_text(apArg[1]);
    }
    rc = rtreeCheckTable(sqlite3_context_db_handle(ctx), zDb, zTab, &zReport);
    if( rc==SQLITE_OK ){
      sqlite3_result_text(ctx, zReport ? zReport : "ok", -1, SQLITE_TRANSIENT);
    }else{
      sqlite3_result_error_code(ctx, rc);
    }
    sqlite3_free(zReport);
  }
}